

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConservativeSparseSparseProduct.h
# Opt level: O0

void Eigen::internal::
     conservative_sparse_sparse_product_impl<Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>,Eigen::SparseMatrix<double,0,int>>
               (SparseMatrix<double,_0,_int> *lhs,SparseMatrix<double,_0,_int> *rhs,
               SparseMatrix<double,_0,_int> *res)

{
  double dVar1;
  Scalar SVar2;
  Scalar SVar3;
  Scalar SVar4;
  bool bVar5;
  Index IVar6;
  Index IVar7;
  size_type __n;
  char *pcVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  Scalar *pSVar11;
  int __c;
  int __c_00;
  SparseMatrix<double,_0,_int> *__s;
  double dVar12;
  reference rVar13;
  reference local_130;
  Index local_120;
  int local_11c;
  Index i_1;
  Index k_1;
  _Bit_type local_110;
  reference local_108;
  Scalar local_f8;
  Scalar x;
  undefined1 local_e8 [4];
  Index i;
  InnerIterator lhsIt;
  Index k;
  Scalar y;
  InnerIterator rhsIt;
  int local_90;
  Index nnz;
  Index j;
  Index estimated_nnz_prod;
  Matrix<int,__1,_1,_0,__1,_1> indices;
  Matrix<double,__1,_1,_0,__1,_1> values;
  allocator<bool> local_52;
  bool local_51;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> mask;
  Index cols;
  Index rows;
  SparseMatrix<double,_0,_int> *res_local;
  SparseMatrix<double,_0,_int> *rhs_local;
  SparseMatrix<double,_0,_int> *lhs_local;
  
  mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ._4_4_ = SparseMatrix<double,_0,_int>::innerSize(lhs);
  mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
  ._0_4_ = SparseMatrix<double,_0,_int>::outerSize(rhs);
  IVar6 = SparseMatrix<double,_0,_int>::outerSize(lhs);
  IVar7 = SparseMatrix<double,_0,_int>::innerSize(rhs);
  if (IVar6 == IVar7) {
    __n = (size_type)
          mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage._4_4_;
    local_51 = false;
    std::allocator<bool>::allocator(&local_52);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_50,__n,&local_51,&local_52);
    std::allocator<bool>::~allocator(&local_52);
    Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               ,(long)mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_end_of_storage._4_4_);
    Matrix<int,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<int,__1,_1,_0,__1,_1> *)&j,
               (long)mask.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage._4_4_);
    IVar6 = SparseMatrix<double,_0,_int>::nonZeros(lhs);
    IVar7 = SparseMatrix<double,_0,_int>::nonZeros(rhs);
    SparseMatrix<double,_0,_int>::setZero(res);
    SparseMatrix<double,_0,_int>::reserve(res,IVar6 + IVar7);
    for (local_90 = 0;
        local_90 <
        (Index)mask.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage; local_90 = local_90 + 1) {
      SparseMatrix<double,_0,_int>::startVec(res,local_90);
      rhsIt._28_4_ = 0;
      __s = rhs;
      SparseMatrix<double,_0,_int>::InnerIterator::InnerIterator((InnerIterator *)&y,rhs,local_90);
      while( true ) {
        bVar5 = SparseMatrix::InnerIterator::operator_cast_to_bool((InnerIterator *)&y);
        if (!bVar5) break;
        pSVar11 = SparseMatrix<double,_0,_int>::InnerIterator::value((InnerIterator *)&y);
        dVar1 = *pSVar11;
        pcVar8 = SparseMatrix<double,_0,_int>::InnerIterator::index
                           ((InnerIterator *)&y,(char *)__s,__c);
        lhsIt._28_4_ = SUB84(pcVar8,0);
        __s = lhs;
        SparseMatrix<double,_0,_int>::InnerIterator::InnerIterator
                  ((InnerIterator *)local_e8,lhs,lhsIt._28_4_);
        while( true ) {
          bVar5 = SparseMatrix::InnerIterator::operator_cast_to_bool((InnerIterator *)local_e8);
          if (!bVar5) break;
          pcVar8 = SparseMatrix<double,_0,_int>::InnerIterator::index
                             ((InnerIterator *)local_e8,(char *)__s,__c_00);
          x._4_4_ = (int)pcVar8;
          pSVar11 = SparseMatrix<double,_0,_int>::InnerIterator::value((InnerIterator *)local_e8);
          local_f8 = *pSVar11;
          rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_50,(long)x._4_4_);
          local_108 = rVar13;
          bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_108);
          SVar3 = local_f8;
          if (((bVar5 ^ 0xffU) & 1) == 0) {
            __s = (SparseMatrix<double,_0,_int> *)(long)x._4_4_;
            pSVar10 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                 &indices.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows,(Index)__s);
            *pSVar10 = SVar3 * dVar1 + *pSVar10;
          }
          else {
            rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)local_50,(long)x._4_4_);
            _i_1 = rVar13;
            std::_Bit_reference::operator=((_Bit_reference *)&i_1,true);
            dVar12 = local_f8 * dVar1;
            pSVar10 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                                 &indices.
                                  super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                                  m_storage.m_rows,(long)x._4_4_);
            SVar4 = x._4_4_;
            *pSVar10 = dVar12;
            __s = (SparseMatrix<double,_0,_int> *)(long)(int)rhsIt._28_4_;
            pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&j,
                                (Index)__s);
            *pSVar9 = SVar4;
            rhsIt._28_4_ = rhsIt._28_4_ + 1;
          }
          SparseMatrix<double,_0,_int>::InnerIterator::operator++((InnerIterator *)local_e8);
        }
        SparseMatrix<double,_0,_int>::InnerIterator::operator++((InnerIterator *)&y);
      }
      for (local_11c = 0; local_11c < (int)rhsIt._28_4_; local_11c = local_11c + 1) {
        pSVar9 = DenseCoeffsBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>,_1> *)&j,
                            (long)local_11c);
        local_120 = *pSVar9;
        pSVar10 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                             &indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
                              m_storage.m_rows,(long)local_120);
        SVar2 = *pSVar10;
        pSVar11 = SparseMatrix<double,_0,_int>::insertBackByOuterInnerUnordered
                            (res,local_90,local_120);
        *pSVar11 = SVar2;
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)local_50,(long)local_120);
        local_130 = rVar13;
        std::_Bit_reference::operator=(&local_130,false);
      }
    }
    SparseMatrix<double,_0,_int>::finalize(res);
    Matrix<int,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<int,__1,_1,_0,__1,_1> *)&j);
    Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              );
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_50);
    return;
  }
  __assert_fail("lhs.outerSize() == rhs.innerSize()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/./Eigen/src/SparseCore/ConservativeSparseSparseProduct.h"
                ,0x1a,
                "void Eigen::internal::conservative_sparse_sparse_product_impl(const Lhs &, const Rhs &, ResultType &) [Lhs = Eigen::SparseMatrix<double>, Rhs = Eigen::SparseMatrix<double>, ResultType = Eigen::SparseMatrix<double>]"
               );
}

Assistant:

static void conservative_sparse_sparse_product_impl(const Lhs& lhs, const Rhs& rhs, ResultType& res)
{
  typedef typename remove_all<Lhs>::type::Scalar Scalar;
  typedef typename remove_all<Lhs>::type::Index Index;

  // make sure to call innerSize/outerSize since we fake the storage order.
  Index rows = lhs.innerSize();
  Index cols = rhs.outerSize();
  eigen_assert(lhs.outerSize() == rhs.innerSize());

  std::vector<bool> mask(rows,false);
  Matrix<Scalar,Dynamic,1> values(rows);
  Matrix<Index,Dynamic,1>  indices(rows);

  // estimate the number of non zero entries
  // given a rhs column containing Y non zeros, we assume that the respective Y columns
  // of the lhs differs in average of one non zeros, thus the number of non zeros for
  // the product of a rhs column with the lhs is X+Y where X is the average number of non zero
  // per column of the lhs.
  // Therefore, we have nnz(lhs*rhs) = nnz(lhs) + nnz(rhs)
  Index estimated_nnz_prod = lhs.nonZeros() + rhs.nonZeros();

  res.setZero();
  res.reserve(Index(estimated_nnz_prod));
  // we compute each column of the result, one after the other
  for (Index j=0; j<cols; ++j)
  {

    res.startVec(j);
    Index nnz = 0;
    for (typename Rhs::InnerIterator rhsIt(rhs, j); rhsIt; ++rhsIt)
    {
      Scalar y = rhsIt.value();
      Index k = rhsIt.index();
      for (typename Lhs::InnerIterator lhsIt(lhs, k); lhsIt; ++lhsIt)
      {
        Index i = lhsIt.index();
        Scalar x = lhsIt.value();
        if(!mask[i])
        {
          mask[i] = true;
          values[i] = x * y;
          indices[nnz] = i;
          ++nnz;
        }
        else
          values[i] += x * y;
      }
    }

    // unordered insertion
    for(Index k=0; k<nnz; ++k)
    {
      Index i = indices[k];
      res.insertBackByOuterInnerUnordered(j,i) = values[i];
      mask[i] = false;
    }

#if 0
    // alternative ordered insertion code:

    Index t200 = rows/(log2(200)*1.39);
    Index t = (rows*100)/139;

    // FIXME reserve nnz non zeros
    // FIXME implement fast sort algorithms for very small nnz
    // if the result is sparse enough => use a quick sort
    // otherwise => loop through the entire vector
    // In order to avoid to perform an expensive log2 when the
    // result is clearly very sparse we use a linear bound up to 200.
    //if((nnz<200 && nnz<t200) || nnz * log2(nnz) < t)
    //res.startVec(j);
    if(true)
    {
      if(nnz>1) std::sort(indices.data(),indices.data()+nnz);
      for(Index k=0; k<nnz; ++k)
      {
        Index i = indices[k];
        res.insertBackByOuterInner(j,i) = values[i];
        mask[i] = false;
      }
    }
    else
    {
      // dense path
      for(Index i=0; i<rows; ++i)
      {
        if(mask[i])
        {
          mask[i] = false;
          res.insertBackByOuterInner(j,i) = values[i];
        }
      }
    }
#endif

  }
  res.finalize();
}